

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFBStreamTest.cpp
# Opt level: O3

int PFBStreamTest(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EStatusCode EVar2;
  IByteReader *inStreamToDecode;
  IByteWriter *inOutputStream;
  uint uVar3;
  OutputStreamTraits traits;
  OutputFile decodedPFBFile;
  InputFile pfbFile;
  InputPFBDecodeStream decodeStream;
  allocator<char> local_149;
  string local_148;
  string local_128;
  string local_108;
  FileURL local_e8;
  OutputFile local_c8;
  InputFile local_98;
  InputPFBDecodeStream local_68;
  
  InputFile::InputFile(&local_98);
  OutputFile::OutputFile(&local_c8);
  InputPFBDecodeStream::InputPFBDecodeStream(&local_68);
  paVar1 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fonts/HLB_____.PFB","");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,argv[1],&local_149);
  LocalPathToFileURL(&local_e8,&local_108);
  RelativeURLToLocalPath(&local_128,&local_e8,&local_148);
  FileURL::~FileURL(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  InputFile::OpenFile(&local_98,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"decodedPFBFile.txt","");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,argv[2],&local_149);
  LocalPathToFileURL(&local_e8,&local_108);
  RelativeURLToLocalPath(&local_128,&local_e8,&local_148);
  FileURL::~FileURL(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  OutputFile::OpenFile(&local_c8,&local_128,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  inStreamToDecode = &InputFile::GetInputStream(&local_98)->super_IByteReader;
  EVar2 = InputPFBDecodeStream::Assign(&local_68,inStreamToDecode);
  if (EVar2 == eSuccess) {
    inOutputStream = &OutputFile::GetOutputStream(&local_c8)->super_IByteWriter;
    OutputStreamTraits::OutputStreamTraits((OutputStreamTraits *)&local_e8,inOutputStream);
    EVar2 = OutputStreamTraits::CopyToOutputStream
                      ((OutputStreamTraits *)&local_e8,&local_68.super_IByteReader);
    if (EVar2 != eSuccess) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to decode pfb stream",0x1b);
    }
    OutputStreamTraits::~OutputStreamTraits((OutputStreamTraits *)&local_e8);
    uVar3 = (uint)(EVar2 != eSuccess);
  }
  else {
    uVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to assign pfb input stream",0x21);
  }
  InputPFBDecodeStream::Assign(&local_68,(IByteReader *)0x0);
  InputFile::CloseFile(&local_98);
  OutputFile::CloseFile(&local_c8);
  InputPFBDecodeStream::~InputPFBDecodeStream(&local_68);
  OutputFile::~OutputFile(&local_c8);
  InputFile::~InputFile(&local_98);
  return uVar3;
}

Assistant:

int PFBStreamTest(int argc, char* argv[])
{
	EStatusCode status;
	InputFile pfbFile;
	OutputFile decodedPFBFile;
	InputPFBDecodeStream decodeStream;

	do
	{
		pfbFile.OpenFile(BuildRelativeInputPath(argv,"fonts/HLB_____.PFB"));

		decodedPFBFile.OpenFile(BuildRelativeOutputPath(argv,"decodedPFBFile.txt"));


		status = decodeStream.Assign(pfbFile.GetInputStream());
		
		if(status != PDFHummus::eSuccess)
		{
			cout<<"Failed to assign pfb input stream";
			break;
		}

		OutputStreamTraits traits(decodedPFBFile.GetOutputStream());

		status = traits.CopyToOutputStream(&decodeStream);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"Failed to decode pfb stream";
			break;
		}
	}while(false);

	decodeStream.Assign(NULL);
	pfbFile.CloseFile();
	decodedPFBFile.CloseFile();

	return status == eSuccess ? 0:1;
}